

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

void __thiscall
duckdb::WindowBoundariesState::PartitionBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  idx_t chunk_idx;
  reference pvVar4;
  idx_t iVar5;
  long lVar6;
  idx_t n;
  
  pvVar4 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,0);
  pdVar2 = pvVar4->data;
  if (this->partition_count + this->order_count == 0) {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      pdVar1 = pdVar2 + iVar5 * 8;
      pdVar1[0] = '\0';
      pdVar1[1] = '\0';
      pdVar1[2] = '\0';
      pdVar1[3] = '\0';
      pdVar1[4] = '\0';
      pdVar1[5] = '\0';
      pdVar1[6] = '\0';
      pdVar1[7] = '\0';
    }
  }
  else {
    puVar3 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    for (lVar6 = 1; lVar6 - count != 1; lVar6 = lVar6 + 1) {
      if ((puVar3[row_idx >> 6] >> (row_idx & 0x3f) & 1) == 0) {
        if ((is_jump & 1U) != 0) goto LAB_015bda88;
        iVar5 = this->partition_start;
      }
      else if ((is_jump & 1U) == 0) {
        this->partition_start = row_idx;
        iVar5 = row_idx;
      }
      else {
LAB_015bda88:
        n = 1;
        is_jump = false;
        iVar5 = FindPrevStart(partition_mask,0,row_idx + 1,&n);
        this->partition_start = iVar5;
      }
      *(idx_t *)(pdVar2 + lVar6 * 8 + -8) = iVar5;
      row_idx = row_idx + 1;
    }
  }
  return;
}

Assistant:

void WindowBoundariesState::PartitionBegin(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                           const ValidityMask &partition_mask) {
	auto partition_begin_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_BEGIN]);

	//	OVER()
	if (partition_count + order_count == 0) {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			partition_begin_data[chunk_idx] = 0;
		}
		return;
	}

	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		// determine partition and peer group boundaries to ultimately figure out window size
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);

		// when the partition changes, recompute the boundaries
		if (!is_same_partition || is_jump) {
			if (is_jump) {
				idx_t n = 1;
				partition_start = FindPrevStart(partition_mask, 0, row_idx + 1, n);
				is_jump = false;
			} else {
				partition_start = row_idx;
			}
		}

		partition_begin_data[chunk_idx] = partition_start;
	}
}